

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# General.cc
# Opt level: O0

void __thiscall
General_connectionDisconnectDirectly_Test::~General_connectionDisconnectDirectly_Test
          (General_connectionDisconnectDirectly_Test *this)

{
  void *in_RDI;
  
  ~General_connectionDisconnectDirectly_Test((General_connectionDisconnectDirectly_Test *)0x139198);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(General, connectionDisconnectDirectly)
{
  sigs::Signal<void(int &)> s;
  auto conn = s.connect([](int &i) { i++; });

  int i = 0;
  s(i);
  EXPECT_EQ(i, 1);

  conn->disconnect();

  s(i);
  EXPECT_EQ(i, 1);
}